

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::WrapChild
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,string_view prefix,
          string_view postfix,Precedence precedence)

{
  ulong amount;
  const_iterator __position;
  size_t sVar1;
  pointer pbVar2;
  ulong amount_00;
  string_view local_60;
  string local_50;
  
  amount_00 = prefix.size_;
  local_60.data_ = prefix.data_;
  local_60.size_ = amount_00;
  sVar1 = Value::width(child);
  if ((sVar1 + amount_00 + postfix.size_ < this->target_exp_width) ||
     (amount = this->indent_amount, postfix.size_ <= amount && amount_00 <= amount)) {
    pbVar2 = (child->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(child->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x20) {
      std::__cxx11::string::insert((ulong)pbVar2,(char *)0x0,(ulong)prefix.data_);
      pbVar2 = (child->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00169644;
    }
    IndentValue(this,child,amount_00,prefix);
  }
  else {
    IndentValue(this,child,amount,(string_view)ZEXT816(0));
    __position._M_current =
         (child->v).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    string_view::operator_cast_to_string(&local_50,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,__position,&local_50);
    std::__cxx11::string::_M_dispose();
  }
  pbVar2 = (child->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00169644:
  std::__cxx11::string::append((char *)pbVar2,(ulong)postfix.data_);
  child->precedence = precedence;
  Value::Value(__return_storage_ptr__,child);
  return __return_storage_ptr__;
}

Assistant:

Value WrapChild(Value &child, string_view prefix, string_view postfix,
                  Precedence precedence) {
    auto width = prefix.size() + postfix.size() + child.width();
    auto &v = child.v;
    if (width < target_exp_width ||
        (prefix.size() <= indent_amount && postfix.size() <= indent_amount)) {
      if (v.size() == 1) {
        // Fits in a single line.
        v[0].insert(0, prefix.data(), prefix.size());
        v[0].append(postfix.data(), postfix.size());
      } else {
        // Multiline, but with prefix on same line.
        IndentValue(child, prefix.size(), prefix);
        v.back().append(postfix.data(), postfix.size());
      }
    } else {
      // Multiline with prefix on its own line.
      IndentValue(child, indent_amount, {});
      v.insert(v.begin(), std::string(prefix));
      v.back().append(postfix.data(), postfix.size());
    }
    child.precedence = precedence;
    return std::move(child);
  }